

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O0

int stumpless_trace_entry
              (stumpless_target *target,stumpless_entry *entry,char *file,int line,char *func)

{
  _Bool _Var1;
  char *local_80;
  char *line_str;
  char digits [50];
  char *func_local;
  int line_local;
  char *file_local;
  stumpless_entry *entry_local;
  stumpless_target *target_local;
  
  if (entry == (stumpless_entry *)0x0) {
    raise_argument_empty("entry was NULL");
    target_local._4_4_ = -1;
  }
  else if (file == (char *)0x0) {
    raise_argument_empty("file was NULL");
    target_local._4_4_ = -1;
  }
  else if (func == (char *)0x0) {
    raise_argument_empty("func was NULL");
    target_local._4_4_ = -1;
  }
  else {
    digits[0x29] = '\0';
    local_80 = digits + 0x29;
    func_local._4_4_ = line;
    if (line == 0) {
      local_80 = digits + 0x28;
      digits[0x28] = '0';
    }
    else {
      for (; func_local._4_4_ != 0; func_local._4_4_ = func_local._4_4_ / 10) {
        local_80 = local_80 + -1;
        *local_80 = (char)(func_local._4_4_ % 10) + '0';
      }
    }
    stumpless_set_entry_param_value_by_name(entry,"trace","file",file);
    _Var1 = stumpless_has_error();
    if (_Var1) {
      target_local._4_4_ = -1;
    }
    else {
      stumpless_set_entry_param_value_by_name(entry,"trace","line",local_80);
      _Var1 = stumpless_has_error();
      if (_Var1) {
        target_local._4_4_ = -1;
      }
      else {
        stumpless_set_entry_param_value_by_name(entry,"trace","function",func);
        _Var1 = stumpless_has_error();
        if (_Var1) {
          target_local._4_4_ = -1;
        }
        else {
          target_local._4_4_ = stumpless_add_entry(target,entry);
        }
      }
    }
  }
  return target_local._4_4_;
}

Assistant:

int
stumpless_trace_entry( struct stumpless_target *target,
                       struct stumpless_entry *entry,
                       const char *file,
                       int line,
                       const char *func ) {
  char digits[MAX_INT_SIZE];
  char *line_str;

  VALIDATE_ARG_NOT_NULL_INT_RETURN( entry );
  VALIDATE_ARG_NOT_NULL_INT_RETURN( file );
  VALIDATE_ARG_NOT_NULL_INT_RETURN( func );

  digits[MAX_INT_SIZE-1] = '\0';
  line_str = digits + MAX_INT_SIZE - 1;
  if( line == 0 ) {
    line_str--;
    *line_str = '0';
  } else {
    while( line != 0 ) {
      line_str--;
      *line_str = ( line % 10 ) + 48;
      line /= 10;
    }
  }

  stumpless_set_entry_param_value_by_name( entry, "trace", "file", file );
  if( unlikely( stumpless_has_error(  ) ) ) {
    return -1;
  }

  stumpless_set_entry_param_value_by_name( entry, "trace", "line", line_str );
  if( unlikely( stumpless_has_error(  ) ) ) {
    return -1;
  }

  stumpless_set_entry_param_value_by_name( entry, "trace", "function", func );
  if( unlikely( stumpless_has_error(  ) ) ) {
    return -1;
  }

  return stumpless_add_entry( target, entry );
}